

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

void __thiscall
vkt::memory::anon_unknown_0::RenderFragmentUniformTexelBuffer::submit
          (RenderFragmentUniformTexelBuffer *this,SubmitContext *context)

{
  VkCommandBuffer pVVar1;
  DeviceInterface *pDVar2;
  pointer pHVar3;
  ulong uVar4;
  ulong uVar5;
  size_t descriptorSetNdx;
  ulong uVar6;
  long lVar7;
  anon_struct_12_3_59eec259 callParams;
  
  pVVar1 = context->m_commandBuffer;
  pDVar2 = context->m_context->m_context->m_vkd;
  lVar7 = 0;
  (*pDVar2->_vptr_DeviceInterface[0x4c])
            (pDVar2,pVVar1,0,
             (this->m_resources).pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.
             object.m_internal);
  uVar6 = 0;
  while( true ) {
    pHVar3 = (this->m_descriptorSets).
             super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = (long)(this->m_descriptorSets).
                  super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar3 >> 3;
    if (uVar5 <= uVar6) break;
    callParams.callId = (deUint32)uVar6;
    uVar4 = this->m_bufferSize >> 2;
    callParams.maxUniformTexelCount = this->m_maxUniformTexelCount;
    if (callParams.maxUniformTexelCount <= uVar4) {
      uVar4 = (ulong)callParams.maxUniformTexelCount;
    }
    uVar4 = uVar4 * uVar5;
    uVar5 = this->m_targetHeight * this->m_targetWidth;
    callParams.valuesPerPixel = ((int)(uVar4 / uVar5) + 1) - (uint)(uVar4 % uVar5 == 0);
    (*pDVar2->_vptr_DeviceInterface[0x56])
              (pDVar2,pVVar1,0,
               (this->m_resources).pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.
               m_data.object.m_internal,0,1,(long)&pHVar3->m_internal + lVar7,0,0);
    (*pDVar2->_vptr_DeviceInterface[0x73])
              (pDVar2,pVVar1,
               (this->m_resources).pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.
               m_data.object.m_internal,0x10,0,0xc,&callParams);
    (*pDVar2->_vptr_DeviceInterface[0x59])(pDVar2,pVVar1,6,1,0,0);
    uVar6 = uVar6 + 1;
    lVar7 = lVar7 + 8;
  }
  return;
}

Assistant:

void RenderFragmentUniformTexelBuffer::submit (SubmitContext& context)
{
	const vk::DeviceInterface&	vkd				= context.getContext().getDeviceInterface();
	const vk::VkCommandBuffer	commandBuffer	= context.getCommandBuffer();

	vkd.cmdBindPipeline(commandBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_resources.pipeline);

	for (size_t descriptorSetNdx = 0; descriptorSetNdx < m_descriptorSets.size(); descriptorSetNdx++)
	{
		const struct
		{
			const deUint32	callId;
			const deUint32	valuesPerPixel;
			const deUint32	maxUniformTexelCount;
		} callParams =
		{
			(deUint32)descriptorSetNdx,
			(deUint32)divRoundUp<size_t>(m_descriptorSets.size() * de::min<size_t>((size_t)m_bufferSize / 4, m_maxUniformTexelCount), m_targetWidth * m_targetHeight),
			m_maxUniformTexelCount
		};

		vkd.cmdBindDescriptorSets(commandBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_resources.pipelineLayout, 0u, 1u, &m_descriptorSets[descriptorSetNdx], 0u, DE_NULL);
		vkd.cmdPushConstants(commandBuffer, *m_resources.pipelineLayout, vk::VK_SHADER_STAGE_FRAGMENT_BIT, 0u, (deUint32)sizeof(callParams), &callParams);
		vkd.cmdDraw(commandBuffer, 6, 1, 0, 0);
	}
}